

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

int32_t __thiscall
icu_63::Calendar::getActualMinimum(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int32_t value;
  int32_t iVar4;
  Calendar *this_00;
  
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x12])();
  iVar2 = (*(this->super_UObject)._vptr_UObject[0xe])(this,(ulong)field);
  if (iVar1 != iVar2) {
    iVar3 = (*(this->super_UObject)._vptr_UObject[3])(this);
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar3);
    if (this_00 == (Calendar *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      iVar1 = 0;
    }
    else {
      this_00->fLenient = '\x01';
      iVar3 = iVar1;
      do {
        value = iVar1;
        set(this_00,field,value);
        iVar4 = 0;
        if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
           (complete(this_00,status), *status < U_ILLEGAL_ARGUMENT_ERROR)) {
          iVar4 = this_00->fFields[field];
        }
      } while ((value == iVar4) && (iVar1 = value + -1, iVar3 = value, iVar2 < value));
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
      iVar1 = 0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar1 = iVar3;
      }
    }
  }
  return iVar1;
}

Assistant:

int32_t
Calendar::getActualMinimum(UCalendarDateFields field, UErrorCode& status) const
{
    int32_t fieldValue = getGreatestMinimum(field);
    int32_t endValue = getMinimum(field);

    // if we know that the minimum value is always the same, just return it
    if (fieldValue == endValue) {
        return fieldValue;
    }

    // clone the calendar so we don't mess with the real one, and set it to
    // accept anything for the field values
    Calendar *work = (Calendar*)this->clone();
    if (work == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    work->setLenient(TRUE);

    // now try each value from getLeastMaximum() to getMaximum() one by one until
    // we get a value that normalizes to another value.  The last value that
    // normalizes to itself is the actual minimum for the current date
    int32_t result = fieldValue;

    do {
        work->set(field, fieldValue);
        if (work->get(field, status) != fieldValue) {
            break;
        }
        else {
            result = fieldValue;
            fieldValue--;
        }
    } while (fieldValue >= endValue);

    delete work;

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0;
    }
    return result;
}